

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

archive_wstring * archive_wstring_append(archive_wstring *as,wchar_t *p,size_t s)

{
  archive_wstring *paVar1;
  archive_wstring *in_RDX;
  wchar_t *in_RSI;
  archive_wstring *in_RDI;
  size_t in_stack_ffffffffffffffd8;
  archive_wstring *local_8;
  
  paVar1 = archive_wstring_ensure(in_RDX,in_stack_ffffffffffffffd8);
  if (paVar1 == (archive_wstring *)0x0) {
    local_8 = (archive_wstring *)0x0;
  }
  else {
    wmemcpy(in_RDI->s + in_RDI->length,in_RSI,(size_t)in_RDX);
    in_RDI->length = (long)&in_RDX->s + in_RDI->length;
    in_RDI->s[in_RDI->length] = L'\0';
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

static struct archive_wstring *
archive_wstring_append(struct archive_wstring *as, const wchar_t *p, size_t s)
{
	if (archive_wstring_ensure(as, as->length + s + 1) == NULL)
		return (NULL);
	wmemcpy(as->s + as->length, p, s);
	as->length += s;
	as->s[as->length] = 0;
	return (as);
}